

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pawns.cpp
# Opt level: O2

int __thiscall pawn_table::init(pawn_table *this,EVP_PKEY_CTX *ctx)

{
  undefined1 auVar1 [16];
  size_t sVar2;
  pawn_entry *__p;
  void *pvVar3;
  pawn_entry *ppVar4;
  ulong uVar5;
  ulong uVar6;
  __shared_ptr<pawn_entry[],_(__gnu_cxx::_Lock_policy)2> local_20;
  
  this->sz_mb = 0x2800;
  this->count = 0x8a60;
  sVar2 = pow2(0x8a60);
  uVar6 = 0x400;
  if (0x400 < sVar2) {
    uVar6 = sVar2;
  }
  this->count = uVar6;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar6;
  uVar5 = 0xffffffffffffffff;
  if (SUB168(auVar1 * ZEXT816(0x128),8) == 0) {
    uVar5 = SUB168(auVar1 * ZEXT816(0x128),0);
  }
  __p = (pawn_entry *)operator_new__(uVar5);
  ppVar4 = __p;
  do {
    ppVar4->key = 0;
    ppVar4->score = 0;
    ppVar4 = ppVar4 + 1;
  } while (ppVar4 != __p + uVar6);
  std::__shared_ptr<pawn_entry[],(__gnu_cxx::_Lock_policy)2>::__shared_ptr<pawn_entry,void>
            ((__shared_ptr<pawn_entry[],(__gnu_cxx::_Lock_policy)2> *)&local_20,__p);
  std::__shared_ptr<pawn_entry[],_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->entries).super___shared_ptr<pawn_entry[],_(__gnu_cxx::_Lock_policy)2>,&local_20
            );
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  pvVar3 = memset((this->entries).super___shared_ptr<pawn_entry[],_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr,0,this->count * 0x128);
  return (int)pvVar3;
}

Assistant:

void pawn_table::init() {
	sz_mb = 10 * 1024; // todo : input mb parameter
	count = 1024 * sz_mb / sizeof(pawn_entry);
	count = pow2(count);
	count = (count < 1024 ? 1024 : count);
	entries = std::shared_ptr<pawn_entry[]>(new pawn_entry[count]());
	clear();
}